

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf_tempo.c
# Opt level: O2

void smf_create_tempo_map_and_compute_seconds(smf_t *smf)

{
  smf_event_t *event;
  double dVar1;
  
  smf_rewind(smf);
  smf_init_tempo(smf);
  while( true ) {
    event = smf_get_next_event(smf);
    if (event == (smf_event_t *)0x0) break;
    maybe_add_to_tempo_map(event);
    dVar1 = seconds_from_pulses(smf,event->time_pulses);
    event->time_seconds = dVar1;
  }
  return;
}

Assistant:

void
smf_create_tempo_map_and_compute_seconds(smf_t *smf)
{
	smf_event_t *event;

	smf_rewind(smf);
	smf_init_tempo(smf);

	for (;;) {
		event = smf_get_next_event(smf);
		
		if (event == NULL)
			return;

		maybe_add_to_tempo_map(event);

		event->time_seconds = seconds_from_pulses(smf, event->time_pulses);
	}

	/* Not reached. */
}